

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::torrent::set_piece_deadline
          (torrent *this,piece_index_t piece,int t,deadline_flags_t flags)

{
  _Atomic_word *p_Var1;
  pointer *pppVar2;
  vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
  *this_00;
  element_type *peVar3;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> this_01;
  pointer ppVar4;
  piece_pos pVar5;
  rep rVar6;
  rep rVar7;
  deadline_flags_t dVar8;
  undefined3 uVar9;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> index;
  pointer pptVar10;
  bool bVar11;
  download_priority_t dVar12;
  bool bVar13;
  int iVar14;
  difference_type __d;
  time_point tVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer ptVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  pointer ptVar20;
  pointer ptVar21;
  char *pcVar22;
  piece_picker *ppVar23;
  const_iterator __position;
  __uniq_ptr_data<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>,_true,_true>
  _Var24;
  shared_ptr<libtorrent::aux::torrent> self;
  vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
  downloaders;
  downloading_piece pi;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_8c;
  undefined1 local_88 [24];
  element_type *peStack_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_> local_58
  ;
  piece_block local_3c;
  downloading_piece local_34;
  
  local_8c.m_val = piece.m_val;
  if (((((this->super_torrent_hot_members).field_0x4b & 4) == 0) &&
      (peVar3 = (this->super_torrent_hot_members).m_torrent_file.
                super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
      -1 < piece.m_val && 0 < (peVar3->m_files).m_piece_length)) &&
     (piece.m_val < (peVar3->m_files).m_num_pieces)) {
    tVar15 = time_now();
    bVar11 = is_seed(this);
    if ((bVar11) ||
       ((this_01._M_head_impl =
              (this->super_torrent_hot_members).m_picker._M_t.
              super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
              ._M_t.
              super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
              .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,
        this_01._M_head_impl != (piece_picker *)0x0 &&
        (bVar11 = piece_picker::has_piece_passed(this_01._M_head_impl,piece), bVar11)))) {
      if ((flags.m_val & 1) != 0) {
        read_piece(this,piece);
        return;
      }
    }
    else {
      ptVar16 = (this->m_time_critical_pieces).
                super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ptVar21 = (this->m_time_critical_pieces).
                super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ptVar16 == ptVar21) {
        ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<libtorrent::aux::torrent,void>
                  ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)local_88,
                   (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
                   &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
        iVar14 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[7])();
        local_58.
        super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_88._0_8_;
        local_58.
        super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_88._8_8_;
        pcVar22 = (char *)local_88._0_8_;
        if ((piece_picker *)local_88._8_8_ != (piece_picker *)0x0) {
          pcVar22 = &__libc_single_threaded;
          if (__libc_single_threaded == '\0') {
            LOCK();
            pppVar2 = &(((vector<piece_pos,_piece_index_t> *)local_88._8_8_)->
                       super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                       ).
                       super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *(int *)pppVar2 = *(int *)pppVar2 + 1;
            UNLOCK();
          }
          else {
            pppVar2 = &(((vector<piece_pos,_piece_index_t> *)local_88._8_8_)->
                       super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                       ).
                       super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *(int *)pppVar2 = *(int *)pppVar2 + 1;
          }
        }
        boost::asio::
        post<boost::asio::io_context,libtorrent::aux::torrent::set_piece_deadline(libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,int,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::deadline_flags_tag,void>)::__0>
                  ((io_context *)CONCAT44(extraout_var_00,iVar14),(type *)&local_58,pcVar22);
        if ((piece_picker *)
            local_58.
            super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
            ._M_impl.super__Vector_impl_data._M_finish != (piece_picker *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_58.
                     super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        }
        if ((piece_picker *)local_88._8_8_ != (piece_picker *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
        }
        ptVar16 = (this->m_time_critical_pieces).
                  super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ptVar21 = (this->m_time_critical_pieces).
                  super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        piece.m_val = local_8c.m_val;
      }
      _Var24.
      super___uniq_ptr_impl<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
      ._M_t.
      super__Tuple_impl<0UL,_libtorrent::aux::hash_picker_*,_std::default_delete<libtorrent::aux::hash_picker>_>
      .super__Head_base<0UL,_libtorrent::aux::hash_picker_*,_false>._M_head_impl =
           (__uniq_ptr_impl<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
            )((long)tVar15.__d.__r + (long)t * 1000000);
      this_00 = &this->m_time_critical_pieces;
      if (ptVar16 != ptVar21) {
        while (ptVar20 = ptVar16 + 1, (ptVar16->piece).m_val != piece.m_val) {
          ptVar16 = ptVar20;
          if (ptVar20 == ptVar21) goto LAB_0031d796;
        }
        (ptVar16->deadline).__d.__r =
             (rep)_Var24.
                  super___uniq_ptr_impl<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_libtorrent::aux::hash_picker_*,_std::default_delete<libtorrent::aux::hash_picker>_>
                  .super__Head_base<0UL,_libtorrent::aux::hash_picker_*,_false>._M_head_impl;
        (ptVar16->flags).m_val = flags.m_val;
        while ((ptVar20 !=
                (this->m_time_critical_pieces).
                super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
                ._M_impl.super__Vector_impl_data._M_finish &&
               ((ptVar20->deadline).__d.__r < ptVar20[-1].deadline.__d.__r))) {
          local_68._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&ptVar20[-1].piece;
          local_88._0_8_ = ptVar20[-1].first_requested.__d.__r;
          local_88._8_8_ = ptVar20[-1].last_requested.__d.__r;
          local_88._16_8_ = ptVar20[-1].deadline.__d.__r;
          peStack_70 = *(element_type **)&ptVar20[-1].flags;
          ptVar20[-1].piece.m_val = (ptVar20->piece).m_val;
          rVar6 = (ptVar20->first_requested).__d.__r;
          rVar7 = (ptVar20->last_requested).__d.__r;
          dVar8.m_val = (ptVar20->flags).m_val;
          uVar9 = *(undefined3 *)&ptVar20->field_0x19;
          iVar14 = ptVar20->peers;
          ptVar20[-1].deadline.__d.__r = (ptVar20->deadline).__d.__r;
          ptVar20[-1].flags = (deadline_flags_t)dVar8.m_val;
          *(undefined3 *)&ptVar20[-1].field_0x19 = uVar9;
          ptVar20[-1].peers = iVar14;
          ptVar20[-1].first_requested.__d.__r = rVar6;
          ptVar20[-1].last_requested.__d.__r = rVar7;
          (ptVar20->piece).m_val = local_68._M_pi._0_4_;
          (ptVar20->deadline).__d.__r = local_88._16_8_;
          *(element_type **)&ptVar20->flags = peStack_70;
          (ptVar20->first_requested).__d.__r = local_88._0_8_;
          (ptVar20->last_requested).__d.__r = local_88._8_8_;
          ptVar20 = ptVar20 + 1;
        }
        ptVar20 = ptVar20 + -1;
        if (ptVar20 !=
            (this_00->
            super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
            )._M_impl.super__Vector_impl_data._M_start) {
          do {
            if (ptVar20[-1].deadline.__d.__r <= (ptVar20->deadline).__d.__r) break;
            local_68._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&ptVar20->piece;
            local_88._0_8_ = (ptVar20->first_requested).__d.__r;
            local_88._8_8_ = (ptVar20->last_requested).__d.__r;
            local_88._16_8_ = (ptVar20->deadline).__d.__r;
            peStack_70 = *(element_type **)&ptVar20->flags;
            rVar6 = ptVar20[-1].last_requested.__d.__r;
            rVar7 = ptVar20[-1].deadline.__d.__r;
            dVar8.m_val = ptVar20[-1].flags.m_val;
            uVar9 = *(undefined3 *)&ptVar20[-1].field_0x19;
            iVar14 = ptVar20[-1].peers;
            (ptVar20->first_requested).__d.__r = ptVar20[-1].first_requested.__d.__r;
            (ptVar20->last_requested).__d.__r = rVar6;
            (ptVar20->deadline).__d.__r = rVar7;
            ptVar20->flags = (deadline_flags_t)dVar8.m_val;
            *(undefined3 *)&ptVar20->field_0x19 = uVar9;
            ptVar20->peers = iVar14;
            (ptVar20->piece).m_val = ptVar20[-1].piece.m_val;
            ptVar20[-1].first_requested.__d.__r = local_88._0_8_;
            ptVar20[-1].last_requested.__d.__r = local_88._8_8_;
            ptVar20[-1].deadline.__d.__r = local_88._16_8_;
            *(element_type **)&ptVar20[-1].flags = peStack_70;
            ptVar20[-1].piece.m_val = local_68._M_pi._0_4_;
            ptVar20 = ptVar20 + -1;
          } while (ptVar20 !=
                   (this_00->
                   super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
                   )._M_impl.super__Vector_impl_data._M_start);
        }
        dVar12 = piece_picker::piece_priority
                           ((this->super_torrent_hot_members).m_picker._M_t.
                            super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                            .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                            _M_head_impl,piece);
        bVar11 = is_finished(this);
        bVar13 = piece_picker::set_piece_priority
                           ((this->super_torrent_hot_members).m_picker._M_t.
                            super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                            .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                            _M_head_impl,piece,(download_priority_t)0x7);
        if (dVar12.m_val != '\0') {
          return;
        }
        update_gauge(this);
        if (!bVar13) {
          return;
        }
        update_peer_interest(this,bVar11);
        return;
      }
LAB_0031d796:
      need_picker(this);
      local_88._0_8_ = -0x8000000000000000;
      local_88._8_8_ =
           (__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
            )0x8000000000000000;
      peStack_70 = (element_type *)CONCAT71(peStack_70._1_7_,flags.m_val);
      peStack_70 = (element_type *)((ulong)peStack_70 & 0xffffffff);
      local_68._M_pi._0_4_ = piece.m_val;
      __position._M_current =
           (this->m_time_critical_pieces).
           super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
           ._M_impl.super__Vector_impl_data._M_start;
      uVar17 = (long)(this->m_time_critical_pieces).
                     super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)__position._M_current;
      if (0 < (long)uVar17) {
        uVar17 = (uVar17 >> 3) * -0x3333333333333333;
        do {
          uVar18 = uVar17 >> 1;
          uVar19 = uVar18;
          if (__position._M_current[uVar18].deadline.__d.__r <=
              (long)_Var24.
                    super___uniq_ptr_impl<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_libtorrent::aux::hash_picker_*,_std::default_delete<libtorrent::aux::hash_picker>_>
                    .super__Head_base<0UL,_libtorrent::aux::hash_picker_*,_false>._M_head_impl) {
            uVar19 = ~uVar18 + uVar17;
            __position._M_current = __position._M_current + uVar18 + 1;
          }
          uVar17 = uVar19;
        } while (0 < (long)uVar19);
      }
      local_88._16_8_ =
           _Var24.
           super___uniq_ptr_impl<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
           ._M_t.
           super__Tuple_impl<0UL,_libtorrent::aux::hash_picker_*,_std::default_delete<libtorrent::aux::hash_picker>_>
           .super__Head_base<0UL,_libtorrent::aux::hash_picker_*,_false>._M_head_impl;
      ::std::
      vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
      ::insert(this_00,__position,(value_type *)local_88);
      index.m_val = local_8c.m_val;
      dVar12 = piece_picker::piece_priority
                         ((this->super_torrent_hot_members).m_picker._M_t.
                          super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                          .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                          _M_head_impl,(piece_index_t)local_8c.m_val);
      bVar11 = is_finished(this);
      bVar13 = piece_picker::set_piece_priority
                         ((this->super_torrent_hot_members).m_picker._M_t.
                          super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                          .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                          _M_head_impl,(piece_index_t)index.m_val,(download_priority_t)0x7);
      if ((dVar12.m_val == '\0') && (update_gauge(this), bVar13)) {
        update_peer_interest(this,bVar11);
      }
      local_34.index.m_val = 0x7fffffff;
      local_34.info_idx = 0xffff;
      local_34._6_4_ = 0;
      local_34._10_2_ = 0;
      piece_picker::piece_info
                ((this->super_torrent_hot_members).m_picker._M_t.
                 super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                 .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,
                 (piece_index_t)index.m_val,&local_34);
      if ((local_34._10_2_ & 0x7fff) != 0) {
        piece_picker::get_downloaders
                  (&local_58,
                   (this->super_torrent_hot_members).m_picker._M_t.
                   super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                   .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,
                   (piece_index_t)index.m_val);
        pptVar10 = local_58.
                   super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        if (local_58.
            super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_58.
            super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          iVar14 = 0;
          ppVar23 = (piece_picker *)
                    local_58.
                    super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            ppVar4 = (ppVar23->m_piece_map).
                     super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                     .
                     super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((ppVar4 != (pointer)0x0) && (pVar5 = ppVar4[1], pVar5 != (piece_pos)0x0)) {
              local_3c.piece_index.m_val = index.m_val;
              local_3c.block_index = iVar14;
              peer_connection::make_time_critical
                        ((peer_connection *)((long)pVar5 + -0x80),&local_3c);
            }
            ppVar23 = (piece_picker *)
                      &(ppVar23->m_piece_map).
                       super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                       .
                       super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            iVar14 = iVar14 + 1;
          } while (ppVar23 != (piece_picker *)pptVar10);
        }
        if ((piece_picker *)
            local_58.
            super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (piece_picker *)0x0) {
          operator_delete(local_58.
                          super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_58.
                                super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.
                                super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
    }
  }
  else if ((flags.m_val & 1) != 0) {
    iVar14 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[5])();
    get_handle((torrent *)local_88);
    local_58.
    super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT35(local_58.
                           super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                           ._M_impl.super__Vector_impl_data._M_start._5_3_,0x10000007d);
    local_58.
    super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)&boost::system::detail::cat_holder<void>::generic_category_instance;
    alert_manager::
    emplace_alert<libtorrent::read_piece_alert,libtorrent::torrent_handle,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,boost::system::error_code>
              ((alert_manager *)CONCAT44(extraout_var,iVar14),(torrent_handle *)local_88,&local_8c,
               (error_code *)&local_58);
    if ((_Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>)local_88._8_8_ !=
        (_Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)
                 ((long)&(((vector<piece_pos,_piece_index_t> *)local_88._8_8_)->
                         super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                         ).
                         super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 4);
        iVar14 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar14 = *(_Atomic_word *)
                  ((long)&(((vector<piece_pos,_piece_index_t> *)local_88._8_8_)->
                          super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                          ).
                          super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 4);
        *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_88._8_8_)->
                        super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                        ).
                        super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                        ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar14 + -1;
      }
      if (iVar14 == 1) {
        (*(code *)(((vector<piece_pos,_piece_index_t> *)local_88._8_8_)->
                  super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                  ).
                  super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                  ._M_impl.super__Vector_impl_data._M_start[3])();
      }
    }
  }
  return;
}

Assistant:

void torrent::set_piece_deadline(piece_index_t const piece, int const t
		, deadline_flags_t const flags)
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT_PRECOND(piece >= piece_index_t(0));
		TORRENT_ASSERT_PRECOND(valid_metadata());
		TORRENT_ASSERT_PRECOND(valid_metadata() && piece < m_torrent_file->end_piece());

		if (m_abort || !valid_metadata()
			|| piece < piece_index_t(0)
			|| piece >= m_torrent_file->end_piece())
		{
			// failed
			if (flags & torrent_handle::alert_when_available)
			{
				m_ses.alerts().emplace_alert<read_piece_alert>(
					get_handle(), piece, error_code(boost::system::errc::operation_canceled, generic_category()));
			}
			return;
		}

		time_point const deadline = aux::time_now() + milliseconds(t);

		// if we already have the piece, no need to set the deadline.
		// however, if the user asked to get the piece data back, we still
		// need to read it and post it back to the user
		if (is_seed() || (has_picker() && m_picker->has_piece_passed(piece)))
		{
			if (flags & torrent_handle::alert_when_available)
				read_piece(piece);
			return;
		}

		// if this is the first time critical piece we add. in order to make it
		// react quickly, cancel all the currently outstanding requests
		if (m_time_critical_pieces.empty())
		{
			// defer this by posting it to the end of the message queue.
			// this gives the client a chance to specify multiple time-critical
			// pieces before libtorrent cancels requests
			auto self = shared_from_this();
			post(m_ses.get_context(), [self] { self->wrap(&torrent::cancel_non_critical); });
		}

		for (auto i = m_time_critical_pieces.begin()
			, end(m_time_critical_pieces.end()); i != end; ++i)
		{
			if (i->piece != piece) continue;
			i->deadline = deadline;
			i->flags = flags;

			// resort i since deadline might have changed
			while (std::next(i) != m_time_critical_pieces.end() && i->deadline > std::next(i)->deadline)
			{
				std::iter_swap(i, std::next(i));
				++i;
			}
			while (i != m_time_critical_pieces.begin() && i->deadline < std::prev(i)->deadline)
			{
				std::iter_swap(i, std::prev(i));
				--i;
			}
			// just in case this piece had priority 0
			download_priority_t const prev_prio = m_picker->piece_priority(piece);
			bool const was_finished = is_finished();
			bool const filter_updated = m_picker->set_piece_priority(piece, top_priority);
			if (prev_prio == dont_download)
			{
				update_gauge();
				if (filter_updated) update_peer_interest(was_finished);
			}
			return;
		}

		need_picker();

		time_critical_piece p;
		p.first_requested = min_time();
		p.last_requested = min_time();
		p.flags = flags;
		p.deadline = deadline;
		p.peers = 0;
		p.piece = piece;
		auto const critical_piece_it = std::upper_bound(m_time_critical_pieces.begin()
			, m_time_critical_pieces.end(), p);
		m_time_critical_pieces.insert(critical_piece_it, p);

		// just in case this piece had priority 0
		download_priority_t const prev_prio = m_picker->piece_priority(piece);
		bool const was_finished = is_finished();
		bool const filter_updated = m_picker->set_piece_priority(piece, top_priority);
		if (prev_prio == dont_download)
		{
			update_gauge();
			if (filter_updated) update_peer_interest(was_finished);
		}

		piece_picker::downloading_piece pi;
		m_picker->piece_info(piece, pi);
		if (pi.requested == 0) return;
		// this means we have outstanding requests (or queued
		// up requests that haven't been sent yet). Promote them
		// to deadline pieces immediately
		std::vector<torrent_peer*> const downloaders
			= m_picker->get_downloaders(piece);

		int block = 0;
		for (auto i = downloaders.begin()
			, end(downloaders.end()); i != end; ++i, ++block)
		{
			torrent_peer* const tp = *i;
			if (tp == nullptr || tp->connection == nullptr) continue;
			auto* peer = static_cast<peer_connection*>(tp->connection);
			peer->make_time_critical(piece_block(piece, block));
		}
	}